

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O2

void deqp::egl::Image::initializeStencilRbo(Functions *gl,GLuint rbo,Texture2D *ref)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  GLenum GVar4;
  int iVar5;
  deUint32 *pdVar6;
  uint uVar7;
  long lVar8;
  float fVar9;
  int width;
  int height;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  TextureFormat local_60;
  PixelBufferAccess local_58;
  
  local_60 = tcu::getEffectiveDepthStencilTextureFormat
                       ((TextureFormat *)
                        (ref->super_TextureLevelPyramid).m_access.
                        super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start,MODE_STENCIL);
  tcu::getTextureFormatBitDepth((tcu *)&local_58,&local_60);
  uVar7 = ~(-1 << ((byte)local_58.super_ConstPixelBufferAccess.m_format.order & 0x1f));
  if (0x1f < (int)local_58.super_ConstPixelBufferAccess.m_format.order) {
    uVar7 = 0xffffffff;
  }
  (*gl->framebufferRenderbuffer)(0x8d40,0x8d20,0x8d41,rbo);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,
                  "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, rbo)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x16d);
  (*gl->clearStencil)(0);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"clearStencil(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x16e);
  (*gl->clear)(0x400);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"clear(GL_STENCIL_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x16f);
  tcu::clearStencil((ref->super_TextureLevelPyramid).m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,0);
  (*gl->enable)(0xc11);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"enable(GL_SCISSOR_TEST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x173);
  pdVar6 = initializeStencilRbo::stencilValues;
  lVar8 = 10;
  while( true ) {
    if (lVar8 == 0) break;
    fVar9 = (float)(int)lVar8;
    uVar1 = ref->m_width;
    uVar2 = ref->m_height;
    auVar10._0_4_ = (float)(int)uVar1;
    auVar10._4_4_ = (float)(int)uVar2;
    auVar10._8_8_ = 0;
    auVar10 = divps(auVar10,_DAT_017fdbe0);
    width = (int)(fVar9 * auVar10._0_4_);
    height = (int)(fVar9 * auVar10._4_4_);
    auVar11._0_4_ = -(uint)(width == 0);
    auVar11._4_4_ = -(uint)(width == 0);
    auVar11._8_4_ = -(uint)(height == 0);
    auVar11._12_4_ = -(uint)(height == 0);
    iVar5 = movmskpd((int)lVar8,auVar11);
    if (iVar5 != 0) break;
    uVar3 = *pdVar6;
    (*gl->scissor)(0,0,width,height);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"scissor(0, 0, size.x(), size.y())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x17d);
    (*gl->clearStencil)(uVar3 & uVar7);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"clearStencil(stencil)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x17e);
    (*gl->clear)(0x400);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"clear(GL_STENCIL_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x17f);
    tcu::getSubregion(&local_58,
                      (ref->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start,0,0,width,height);
    tcu::clearStencil(&local_58,uVar3 & uVar7);
    pdVar6 = pdVar6 + 1;
    lVar8 = lVar8 + -1;
  }
  (*gl->disable)(0xc11);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"disable(GL_SCISSOR_TEST)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x184);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8d20,0x8d41,0);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,
                  "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, 0)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                  ,0x186);
  return;
}

Assistant:

void initializeStencilRbo(const glw::Functions& gl, GLuint rbo, Texture2D& ref)
{
	static const deUint32 stencilValues[] =
	{
		0xBF688C11u,
		0xB43D2922u,
		0x055D5FFBu,
		0x9300655Eu,
		0x63BE0DF2u,
		0x0345C13Bu,
		0x1C184832u,
		0xD107040Fu,
		0x9B91569Fu,
		0x0F0CFDC7u,
	};

	const deUint32 numStencilBits	= tcu::getTextureFormatBitDepth(tcu::getEffectiveDepthStencilTextureFormat(ref.getLevel(0).getFormat(), tcu::Sampler::MODE_STENCIL)).x();
	const deUint32 stencilMask		= deBitMask32(0, numStencilBits);

	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT,
												   GL_RENDERBUFFER, rbo));
	GLU_CHECK_GLW_CALL(gl, clearStencil(0));
	GLU_CHECK_GLW_CALL(gl, clear(GL_STENCIL_BUFFER_BIT));
	tcu::clearStencil(ref.getLevel(0), 0);

	// create a pattern
	GLU_CHECK_GLW_CALL(gl, enable(GL_SCISSOR_TEST));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(stencilValues); ++ndx)
	{
		const deUint32		stencil	= stencilValues[ndx] & stencilMask;
		const tcu::IVec2	size	= tcu::IVec2((int)((float)(DE_LENGTH_OF_ARRAY(stencilValues) - ndx) * ((float)ref.getWidth() / float(DE_LENGTH_OF_ARRAY(stencilValues)))),
												 (int)((float)(DE_LENGTH_OF_ARRAY(stencilValues) - ndx) * ((float)ref.getHeight() / float(DE_LENGTH_OF_ARRAY(stencilValues) + 4)))); // not symmetric

		if (size.x() == 0 || size.y() == 0)
			break;

		GLU_CHECK_GLW_CALL(gl, scissor(0, 0, size.x(), size.y()));
		GLU_CHECK_GLW_CALL(gl, clearStencil(stencil));
		GLU_CHECK_GLW_CALL(gl, clear(GL_STENCIL_BUFFER_BIT));

		tcu::clearStencil(tcu::getSubregion(ref.getLevel(0), 0, 0, size.x(), size.y()), stencil);
	}

	GLU_CHECK_GLW_CALL(gl, disable(GL_SCISSOR_TEST));
	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT,
												   GL_RENDERBUFFER, 0));
}